

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

int __thiscall dh::analysis::numberInteger(analysis *this)

{
  TYPE TVar1;
  int iVar2;
  ostream *poVar3;
  int ret;
  token local_1c0;
  stringstream ss;
  ostream local_188 [376];
  
  TVar1 = token::getType((this->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar1 == NUMINT) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    token::getVal_abi_cxx11_
              (&local_1c0._val,
               (this->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::operator<<(local_188,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::istream::operator>>((istream *)&ss,&ret);
    scanner::getToken(&local_1c0,&this->_tokens);
    token::operator=((this->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     &local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return ret;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"[ERROR] Incompitable type: \"");
  TVar1 = token::getType((this->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,TVar1);
  poVar3 = std::operator<<(poVar3,"\" in line ");
  iVar2 = token::getLineno((this->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::operator<<(poVar3," expect int type\n");
  exit(1);
}

Assistant:

int analysis::numberInteger()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in numberInteger\n";
#endif

	if ( tmp->getType() == TYPE::NUMINT)
	{
		::std::stringstream ss;
		ss << tmp->getVal();

		int ret;
		ss >> ret;
		*tmp = _tokens.getToken();

		return ret;
	} else 
	{
		::std::cerr << "[ERROR] Incompitable type: \""
			<< tmp->getType()
			<< "\" in line "
			<< tmp->getLineno()
			<< " expect int type\n";
		::std::exit(1);
	}
}